

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsSamplerObjectTest.cpp
# Opt level: O2

int __thiscall deqp::gls::TextureSamplerTest::init(TextureSamplerTest *this,EVP_PKEY_CTX *ctx)

{
  GLenum GVar1;
  RenderContext *renderCtx;
  bool bVar2;
  ContextType CVar3;
  int extraout_EAX;
  mapped_type *pmVar4;
  ShaderProgram *this_00;
  TestError *this_01;
  char *__s;
  char *__s_00;
  allocator<char> local_1ea;
  allocator<char> local_1e9;
  string local_1e8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  params;
  ProgramSources local_198;
  string local_c8;
  StringTemplate local_a8;
  string local_88;
  string local_68;
  StringTemplate local_48;
  
  GVar1 = this->m_target;
  if (GVar1 == 0xde1) {
    __s = 
    "${FRAG_HDR}uniform ${LOWP} sampler2D u_sampler;\n${FRAG_IN} ${MEDIUMP} vec2 v_texCoord;\nvoid main (void)\n{\n\t${FRAG_COLOR} = texture(u_sampler, v_texCoord);\n}"
    ;
    __s_00 = 
    "${VTX_HDR}${VTX_IN} ${HIGHP} vec2 a_position;\nuniform ${HIGHP} float u_posScale;\n${VTX_OUT} ${MEDIUMP} vec2 v_texCoord;\nvoid main (void)\n{\n\tv_texCoord = a_position;\n\tgl_Position = vec4(u_posScale * a_position, 0.0, 1.0);\n}"
    ;
  }
  else if (GVar1 == 0x8513) {
    __s = 
    "${FRAG_HDR}uniform ${LOWP} samplerCube u_sampler;\n${FRAG_IN} ${MEDIUMP} vec2 v_texCoord;\nvoid main (void)\n{\n\t${FRAG_COLOR} = texture(u_sampler, vec3(cos(3.14 * v_texCoord.y) * sin(3.14 * v_texCoord.x), sin(3.14 * v_texCoord.y), cos(3.14 * v_texCoord.y) * cos(3.14 * v_texCoord.x)));\n}"
    ;
    __s_00 = 
    "${VTX_HDR}${VTX_IN} ${HIGHP} vec4 a_position;\nuniform ${HIGHP} float u_posScale;\n${VTX_OUT} ${MEDIUMP} vec2 v_texCoord;\nvoid main (void)\n{\n\tv_texCoord = a_position.zw;\n\tgl_Position = vec4(u_posScale * a_position.xy, 0.0, 1.0);\n}"
    ;
  }
  else if (GVar1 == 0x806f) {
    __s = 
    "${FRAG_HDR}uniform ${LOWP} sampler3D u_sampler;\n${FRAG_IN} ${MEDIUMP} vec3 v_texCoord;\nvoid main (void)\n{\n\t${FRAG_COLOR} = texture(u_sampler, v_texCoord);\n}"
    ;
    __s_00 = 
    "${VTX_HDR}${VTX_IN} ${HIGHP} vec3 a_position;\nuniform ${HIGHP} float u_posScale;\n${VTX_OUT} ${MEDIUMP} vec3 v_texCoord;\nvoid main (void)\n{\n\tv_texCoord = a_position;\n\tgl_Position = vec4(u_posScale * a_position.xy, 0.0, 1.0);\n}"
    ;
  }
  else {
    __s_00 = (char *)0x0;
    __s = (char *)0x0;
  }
  params._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &params._M_t._M_impl.super__Rb_tree_header._M_header;
  params._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  params._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  params._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       params._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  CVar3.super_ApiType.m_bits = (ApiType)(*this->m_renderCtx->_vptr_RenderContext[2])();
  bVar2 = glu::isGLSLVersionSupported(CVar3,GLSL_VERSION_300_ES);
  if (bVar2) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_198,"VTX_HDR",(allocator<char> *)&local_1e8);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&params,(key_type *)&local_198);
    std::__cxx11::string::assign((char *)pmVar4);
    std::__cxx11::string::~string((string *)&local_198);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_198,"FRAG_HDR",(allocator<char> *)&local_1e8);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&params,(key_type *)&local_198);
    std::__cxx11::string::assign((char *)pmVar4);
    std::__cxx11::string::~string((string *)&local_198);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_198,"VTX_IN",(allocator<char> *)&local_1e8);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&params,(key_type *)&local_198);
    std::__cxx11::string::assign((char *)pmVar4);
    std::__cxx11::string::~string((string *)&local_198);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_198,"VTX_OUT",(allocator<char> *)&local_1e8);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&params,(key_type *)&local_198);
    std::__cxx11::string::assign((char *)pmVar4);
    std::__cxx11::string::~string((string *)&local_198);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_198,"FRAG_IN",(allocator<char> *)&local_1e8);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&params,(key_type *)&local_198);
    std::__cxx11::string::assign((char *)pmVar4);
    std::__cxx11::string::~string((string *)&local_198);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_198,"FRAG_COLOR",(allocator<char> *)&local_1e8);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&params,(key_type *)&local_198);
    std::__cxx11::string::assign((char *)pmVar4);
    std::__cxx11::string::~string((string *)&local_198);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_198,"HIGHP",(allocator<char> *)&local_1e8);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&params,(key_type *)&local_198);
    std::__cxx11::string::assign((char *)pmVar4);
    std::__cxx11::string::~string((string *)&local_198);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_198,"LOWP",(allocator<char> *)&local_1e8);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&params,(key_type *)&local_198);
    std::__cxx11::string::assign((char *)pmVar4);
    std::__cxx11::string::~string((string *)&local_198);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_198,"MEDIUMP",(allocator<char> *)&local_1e8);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&params,(key_type *)&local_198);
    std::__cxx11::string::assign((char *)pmVar4);
  }
  else {
    CVar3.super_ApiType.m_bits = (ApiType)(*this->m_renderCtx->_vptr_RenderContext[2])();
    bVar2 = glu::isGLSLVersionSupported(CVar3,GLSL_VERSION_330);
    if (!bVar2) goto LAB_015034d7;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_198,"VTX_HDR",(allocator<char> *)&local_1e8);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&params,(key_type *)&local_198);
    std::__cxx11::string::assign((char *)pmVar4);
    std::__cxx11::string::~string((string *)&local_198);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_198,"FRAG_HDR",(allocator<char> *)&local_1e8);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&params,(key_type *)&local_198);
    std::__cxx11::string::assign((char *)pmVar4);
    std::__cxx11::string::~string((string *)&local_198);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_198,"VTX_IN",(allocator<char> *)&local_1e8);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&params,(key_type *)&local_198);
    std::__cxx11::string::assign((char *)pmVar4);
    std::__cxx11::string::~string((string *)&local_198);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_198,"VTX_OUT",(allocator<char> *)&local_1e8);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&params,(key_type *)&local_198);
    std::__cxx11::string::assign((char *)pmVar4);
    std::__cxx11::string::~string((string *)&local_198);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_198,"FRAG_IN",(allocator<char> *)&local_1e8);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&params,(key_type *)&local_198);
    std::__cxx11::string::assign((char *)pmVar4);
    std::__cxx11::string::~string((string *)&local_198);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_198,"FRAG_COLOR",(allocator<char> *)&local_1e8);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&params,(key_type *)&local_198);
    std::__cxx11::string::assign((char *)pmVar4);
    std::__cxx11::string::~string((string *)&local_198);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_198,"HIGHP",(allocator<char> *)&local_1e8);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&params,(key_type *)&local_198);
    std::__cxx11::string::assign((char *)pmVar4);
    std::__cxx11::string::~string((string *)&local_198);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_198,"LOWP",(allocator<char> *)&local_1e8);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&params,(key_type *)&local_198);
    std::__cxx11::string::assign((char *)pmVar4);
    std::__cxx11::string::~string((string *)&local_198);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_198,"MEDIUMP",(allocator<char> *)&local_1e8);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&params,(key_type *)&local_198);
    std::__cxx11::string::assign((char *)pmVar4);
  }
  std::__cxx11::string::~string((string *)&local_198);
LAB_015034d7:
  this_00 = (ShaderProgram *)operator_new(0xd0);
  renderCtx = this->m_renderCtx;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,__s_00,&local_1e9);
  tcu::StringTemplate::StringTemplate(&local_48,&local_68);
  tcu::StringTemplate::specialize(&local_1e8,&local_48,&params);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,__s,&local_1ea);
  tcu::StringTemplate::StringTemplate(&local_a8,&local_c8);
  tcu::StringTemplate::specialize(&local_88,&local_a8,&params);
  glu::makeVtxFragSources(&local_198,&local_1e8,&local_88);
  glu::ShaderProgram::ShaderProgram(this_00,renderCtx,&local_198);
  this->m_program = this_00;
  glu::ProgramSources::~ProgramSources(&local_198);
  std::__cxx11::string::~string((string *)&local_88);
  tcu::StringTemplate::~StringTemplate(&local_a8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_1e8);
  tcu::StringTemplate::~StringTemplate(&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  if ((this->m_program->m_program).m_info.linkOk != false) {
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&params._M_t);
    return extraout_EAX;
  }
  glu::operator<<(((this->super_TestCase).super_TestNode.m_testCtx)->m_log,this->m_program);
  this_01 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_01,"Failed to compile shaders",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsSamplerObjectTest.cpp"
             ,0xf8);
  __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void TextureSamplerTest::init (void)
{
	const char* vertexShaderTemplate	= selectVertexShader(m_target);
	const char* fragmentShaderTemplate	= selectFragmentShader(m_target);

	std::map<std::string, std::string>	params;

	if (glu::isGLSLVersionSupported(m_renderCtx.getType(), glu::GLSL_VERSION_300_ES))
	{
		params["VTX_HDR"]		= "#version 300 es\n";
		params["FRAG_HDR"]		= "#version 300 es\nlayout(location = 0) out mediump vec4 o_color;\n";
		params["VTX_IN"]		= "in";
		params["VTX_OUT"]		= "out";
		params["FRAG_IN"]		= "in";
		params["FRAG_COLOR"]	= "o_color";
		params["HIGHP"]			= "highp";
		params["LOWP"]			= "lowp";
		params["MEDIUMP"]		= "mediump";
	}
	else if (glu::isGLSLVersionSupported(m_renderCtx.getType(), glu::GLSL_VERSION_330))
	{
		params["VTX_HDR"]		= "#version 330\n";
		params["FRAG_HDR"]		= "#version 330\nlayout(location = 0) out mediump vec4 o_color;\n";
		params["VTX_IN"]		= "in";
		params["VTX_OUT"]		= "out";
		params["FRAG_IN"]		= "in";
		params["FRAG_COLOR"]	= "o_color";
		params["HIGHP"]			= "highp";
		params["LOWP"]			= "lowp";
		params["MEDIUMP"]		= "mediump";
	}
	else
		DE_ASSERT(false);

	DE_ASSERT(!m_program);
	m_program = new glu::ShaderProgram(m_renderCtx,
									   glu::makeVtxFragSources(tcu::StringTemplate(vertexShaderTemplate).specialize(params),
															   tcu::StringTemplate(fragmentShaderTemplate).specialize(params)));

	if (!m_program->isOk())
	{
		tcu::TestLog& log = m_testCtx.getLog();
		log << *m_program;
		TCU_FAIL("Failed to compile shaders");
	}
}